

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcs.c
# Opt level: O1

mcsseg mcsout(mcscxdef *ctx,uint objid,uchar *ptr,ushort siz,mcsseg oldseg,int dirty)

{
  ushort uVar1;
  mcsdsdef *pmVar2;
  ulong uVar3;
  mcscxdef *pmVar4;
  uint uVar5;
  undefined6 in_register_00000082;
  ushort *puVar6;
  uint uVar7;
  mcsdsdef **ppmVar8;
  ushort uVar9;
  ulong uVar10;
  int iVar11;
  uint uVar12;
  ulong uVar13;
  bool bVar14;
  
  pmVar4 = ctx;
  if ((int)CONCAT62(in_register_00000082,oldseg) != 0xffff) {
    uVar3 = (ulong)oldseg & 0xff;
    pmVar2 = ctx->mcscxtab[oldseg >> 8];
    pmVar4 = (mcscxdef *)(uVar3 * 3);
    if (((((pmVar2[uVar3].mcsdsflg & 1) == 0) && (pmVar2[uVar3].mcsdsobj == objid)) && (dirty == 0))
       && (siz <= pmVar2[uVar3].mcsdssiz)) {
      pmVar2[uVar3].mcsdsflg = pmVar2[uVar3].mcsdsflg | 1;
      return oldseg;
    }
  }
  uVar9 = ctx->mcscxmsg;
  if (uVar9 == 0) {
    uVar3 = 0xffff;
  }
  else {
    uVar13 = 0;
    uVar3 = 0xffff;
    ppmVar8 = ctx->mcscxtab;
    uVar5 = 0;
    while (*ppmVar8 != (mcsdsdef *)0x0) {
      if ((ushort)uVar13 < uVar9) {
        puVar6 = &(*ppmVar8)->mcsdsflg;
        uVar10 = uVar3;
        uVar7 = 0;
        do {
          uVar3 = uVar13;
          iVar11 = (int)uVar3;
          if ((*puVar6 & 1) == 0) {
            uVar1 = puVar6[-4];
            if (((siz <= uVar1) && (((short)uVar10 == -1 || (uVar1 < (ushort)pmVar4)))) &&
               (pmVar4 = (mcscxdef *)(ulong)uVar1, uVar10 = uVar3, uVar1 == siz)) {
              pmVar4 = (mcscxdef *)(ulong)uVar1;
              uVar13 = uVar3;
              break;
            }
          }
          uVar3 = uVar10;
          uVar12 = iVar11 + 1;
          uVar13 = (ulong)uVar12;
          if (uVar9 <= (ushort)uVar12) break;
          puVar6 = puVar6 + 0xc;
          bVar14 = uVar7 < 0xff;
          uVar10 = uVar3;
          uVar7 = uVar7 + 1;
        } while (bVar14);
      }
      if ((((short)uVar3 != -1) && ((ushort)pmVar4 == siz)) || (uVar9 <= (ushort)uVar13)) break;
      ppmVar8 = ppmVar8 + 1;
      bVar14 = 0xfe < uVar5;
      uVar5 = uVar5 + 1;
      if (bVar14) break;
    }
  }
  uVar9 = (ushort)uVar3;
  if (uVar9 == 0xffff) {
    uVar3 = (ulong)siz;
    if ((ctx->mcscxmax < uVar3) && (mcscompact(ctx), ctx->mcscxmax < uVar3)) {
      errsigf(ctx->mcscxerr,"TADS",6);
    }
    uVar9 = ctx->mcscxmsg;
    uVar1 = uVar9 >> 8;
    if (ctx->mcscxtab[uVar1] == (mcsdsdef *)0x0) {
      pmVar2 = (mcsdsdef *)mchalo(ctx->mcscxerr,0x1800,"mcsout");
      ctx->mcscxtab[uVar1] = pmVar2;
    }
    pmVar2 = ctx->mcscxtab[uVar1] + ((ulong)uVar9 & 0xff);
    pmVar2->mcsdsptr = ctx->mcscxtop;
    pmVar2->mcsdssiz = siz;
    pmVar2->mcsdsobj = objid;
    mcswrt(ctx,pmVar2,ptr,siz);
    pmVar2->mcsdsflg = 1;
    ctx->mcscxtop = ctx->mcscxtop + uVar3;
    ctx->mcscxmax = ctx->mcscxmax - uVar3;
    ctx->mcscxmsg = ctx->mcscxmsg + 1;
  }
  else {
    pmVar2 = ctx->mcscxtab[(uVar3 & 0xffff) >> 8] + (uVar3 & 0xff);
    pmVar2->mcsdsobj = objid;
    mcswrt(ctx,pmVar2,ptr,siz);
    *(byte *)&pmVar2->mcsdsflg = (byte)pmVar2->mcsdsflg | 1;
  }
  return uVar9;
}

Assistant:

mcsseg mcsout(mcscxdef *ctx, uint objid, uchar *ptr, ushort siz,
              mcsseg oldseg, int dirty)
{
    mcsdsdef  *desc;
    mcsdsdef **pagep;
    uint       i;
    uint       j;
    mcsseg     min;
    mcsseg     cur;
    ushort     minsiz;
    
    IF_DEBUG(printf("<< mcsout: objid=%d, ptr=%lx, siz=%u, oldseg=%u >>\n",
                    objid, (unsigned long)ptr, siz, oldseg));
    
    /* see if old segment can be reused */
    if (oldseg != MCSSEGINV)
    {
        desc = mcsdsc(ctx, oldseg);
        if (!(desc->mcsdsflg & MCSDSFINUSE)     /* if old seg is not in use */
            && desc->mcsdsobj == objid            /* and it has same object */
            && desc->mcsdssiz >= siz           /* and it's still big enough */
            && !dirty)      /* and the object in memory hasn't been changed */
        {
            /* we can reuse the old segment without rewriting it */
            desc->mcsdsflg |= MCSDSFINUSE;        /* mark segment as in use */
            return(oldseg);
        }
    }
    
    /* look for the smallest unused segment big enough for this object */
    for (cur = 0, min = MCSSEGINV, i = 0, pagep = ctx->mcscxtab
         ; cur < ctx->mcscxmsg && i < MCSPAGETAB && *pagep ; ++pagep, ++i)
    {
        for (j = 0, desc = *pagep ; cur < ctx->mcscxmsg && j < MCSPAGECNT
             ; ++desc, ++j, ++cur)
        {
            if (!(desc->mcsdsflg & MCSDSFINUSE)
                && desc->mcsdssiz >= siz
                && (min == MCSSEGINV || desc->mcsdssiz < minsiz))
            {
                min = cur;
                minsiz = desc->mcsdssiz;
                if (minsiz == siz) break;       /* exact match - we're done */
            }
        }
        /* quit if we found an exact match */
        if (min != MCSSEGINV && minsiz == siz) break;
    }
    
    /* if we found nothing, allocate a new segment if possible */
    if (min == MCSSEGINV)
    {
        if (siz > ctx->mcscxmax)
        {
            /* swap file is too big; compact it and try again */
            mcscompact(ctx);
            if (siz > ctx->mcscxmax)
                errsig(ctx->mcscxerr, ERR_SWAPBIG);
        }
            
        min = ctx->mcscxmsg;
        if ((min >> 8) >= MCSPAGETAB)      /* exceeded pages in page table? */
            errsig(ctx->mcscxerr, ERR_SWAPPG);
        
        if (!ctx->mcscxtab[min >> 8])         /* haven't allocate page yet? */
        {
            ctx->mcscxtab[min >> 8] = 
                (mcsdsdef *)mchalo(ctx->mcscxerr,
                                   (MCSPAGECNT * sizeof(mcsdsdef)),
                                   "mcsout");
        }

        /* set up new descriptor */
        desc = mcsdsc(ctx, min);
        desc->mcsdsptr = ctx->mcscxtop;
        desc->mcsdssiz = siz;
        desc->mcsdsobj = objid;

        /* write out the segment */
        mcswrt(ctx, desc, ptr, siz);
        desc->mcsdsflg = MCSDSFINUSE;

        /* update context information to account for new segment */
        ctx->mcscxtop += siz;             /* add to top seek offset in file */
        ctx->mcscxmax -= siz;                     /* take size out of quota */
        ctx->mcscxmsg++;                /* increment last segment allocated */
        
        return(min);
    }
    else
    {
        desc = mcsdsc(ctx, min);
        desc->mcsdsobj = objid;
        mcswrt(ctx, desc, ptr, siz);
        desc->mcsdsflg |= MCSDSFINUSE;

        return(min);
    }
}